

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O3

void boxcox_eval(double *x,int N,double lambda,double *bxcx)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = macheps();
  if (dVar2 / 744.44 <= ABS(lambda)) {
    if (0 < N) {
      uVar1 = 0;
      do {
        dVar2 = log(x[uVar1]);
        dVar2 = expm1(dVar2 * lambda);
        bxcx[uVar1] = dVar2 / lambda;
        uVar1 = uVar1 + 1;
      } while ((uint)N != uVar1);
    }
  }
  else if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = log(x[uVar1]);
      bxcx[uVar1] = dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

void boxcox_eval(double *x, int N, double lambda,double *bxcx) {
    double eps;
    int i;

    eps = macheps() / 744.44;

    if (fabs(lambda) < eps) {
        for(i = 0; i < N;++i) {
            bxcx[i] = log(x[i]);
        }
    } else {
        for(i = 0; i < N;++i) {
            bxcx[i] = expm1(lambda * log(x[i])) / lambda;
        }
    }

}